

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O1

BCReg snap_usedef(jit_State *J,uint8_t *udf,BCIns *pc,BCReg maxslot)

{
  TValue *pTVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  undefined8 *puVar5;
  uint *puVar6;
  uint uVar7;
  ushort uVar8;
  BCReg BVar9;
  ulong uVar10;
  long lVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong __n;
  
  if (maxslot == 0) {
    return 0;
  }
  __n = (ulong)maxslot;
  memset(udf,1,__n);
  for (puVar5 = (undefined8 *)(J->L->openupval).gcptr64; puVar5 != (undefined8 *)0x0;
      puVar5 = (undefined8 *)*puVar5) {
    pTVar1 = J->L->base;
    if ((TValue *)puVar5[4] < pTVar1) break;
    udf[(long)puVar5[4] - (long)pTVar1 >> 3] = '\0';
  }
  do {
    uVar14 = *pc;
    uVar8 = lj_bc_mode[(byte)uVar14];
    if ((uVar8 & 0x78) == 0x18) {
      udf[uVar14 >> 0x18] = udf[uVar14 >> 0x18] & 0xfe;
    }
    puVar6 = pc + 1;
    bVar3 = (byte)(uVar14 >> 8);
    uVar7 = uVar14 & 0xff;
    switch(uVar8 >> 7 & 0xf) {
    case 3:
      udf[uVar14 >> 0x10 & 0xff] = udf[uVar14 >> 0x10 & 0xff] & 0xfe;
      break;
    case 4:
      uVar4 = uVar14 >> 0x18;
      uVar13 = uVar14 >> 0x10 & 0xff;
      if (uVar4 <= uVar13) {
        uVar10 = (ulong)(uVar14 >> 0x18);
        do {
          udf[uVar10] = udf[uVar10] & 0xfe;
          uVar10 = uVar10 + 1;
        } while (((uVar13 + (uVar14 >> 0x18)) - uVar4) + 1 != uVar10);
        uVar4 = (uint)uVar10;
      }
      if (uVar4 < maxslot) {
        uVar10 = (ulong)uVar4;
        do {
          udf[uVar10] = udf[uVar10] * '\x03';
          uVar10 = uVar10 + 1;
        } while (__n != uVar10);
      }
      break;
    case 6:
      uVar4 = (uVar14 & 0xff) - 0x51;
      if ((uVar4 < 7) && ((0x49U >> (uVar4 & 0x1f) & 1) != 0)) goto switchD_0012ed07_caseD_d;
      if ((uVar14 & 0xff) - 0x4d < 0xfffffffc) break;
      BVar9 = maxslot;
      if (uVar7 != 0x49) {
        BVar9 = ((uVar14 >> 0x10) + (uint)bVar3) - 1;
      }
      uVar10 = 0;
      if (bVar3 != 0) {
        do {
          udf[uVar10] = udf[uVar10] * '\x03';
          uVar10 = uVar10 + 1;
        } while (bVar3 != uVar10);
      }
      if ((uint)uVar10 < BVar9) {
        uVar10 = uVar10 & 0xffffffff;
        do {
          udf[uVar10] = udf[uVar10] & 0xfe;
          uVar10 = uVar10 + 1;
        } while (BVar9 != uVar10);
      }
      if ((uint)uVar10 < maxslot) {
        uVar10 = uVar10 & 0xffffffff;
        do {
          udf[uVar10] = udf[uVar10] * '\x03';
          uVar10 = uVar10 + 1;
        } while (__n != uVar10);
      }
      bVar2 = false;
      puVar5 = (undefined8 *)0x0;
      goto LAB_0012ef77;
    case 0xc:
      goto switchD_0012ed07_caseD_c;
    case 0xd:
switchD_0012ed07_caseD_d:
      uVar4 = (uint)bVar3;
      if ((uVar14 & 0xff) - 0x4d < 5) {
        uVar4 = uVar4 + 3;
LAB_0012eddf:
        if (uVar4 < maxslot) {
          uVar10 = (ulong)uVar4;
          do {
            udf[uVar10] = udf[uVar10] * '\x03';
            uVar10 = uVar10 + 1;
          } while (__n != uVar10);
        }
        puVar5 = (undefined8 *)(ulong)uVar4;
        if (maxslot <= uVar4) {
          puVar5 = (undefined8 *)(ulong)maxslot;
        }
        bVar12 = 0;
      }
      else {
        if ((uVar14 & 0xff) - 0x52 < 3) {
          uVar4 = (uVar4 + *(byte *)((long)pc + -1)) - 1;
          goto LAB_0012eddf;
        }
        if (uVar7 != 0x32) goto LAB_0012eddf;
        bVar12 = (byte)(uVar14 >> 0x1f);
        if ((int)uVar14 < 0) {
          puVar6 = pc + ((ulong)(uVar14 >> 0x10) - 0x7fff);
        }
        puVar5 = (undefined8 *)((ulong)puVar5 & 0xffffffff);
        if ((int)uVar14 >= 0) {
          puVar5 = (undefined8 *)(ulong)maxslot;
        }
      }
      if (bVar12 != 0) break;
      goto LAB_0012ef01;
    }
    uVar8 = uVar8 & 7;
    if (uVar8 == 1) {
      if ((uVar14 & 0xfe) != 0xc) {
        udf[bVar3] = udf[bVar3] * '\x03';
      }
LAB_0012ef25:
      bVar2 = true;
    }
    else {
      if (uVar8 != 2) {
        if (uVar8 == 3) {
          udf[bVar3] = udf[bVar3] & 0xfe;
        }
        goto LAB_0012ef25;
      }
      if ((uVar14 & 0xff) - 0x41 < 6) {
        uVar10 = (ulong)maxslot;
        if ((uVar14 & 0xfd) != 0x41) {
          uVar10 = (ulong)maxslot;
          uVar14 = uVar14 >> 0x10 & 0xff;
          if (uVar14 != 0) {
            uVar10 = (ulong)(uVar14 + bVar3 + 1);
          }
        }
        udf[(ulong)bVar3 + 1] = udf[(ulong)bVar3 + 1] * '\x03';
        uVar7 = uVar7 - 0x45;
        uVar14 = ((uint)(1 < uVar7) * 3 + (uint)bVar3) - 3;
        uVar15 = (ulong)uVar14;
        if (uVar14 < (uint)uVar10) {
          uVar15 = (ulong)uVar14;
          do {
            udf[uVar15] = udf[uVar15] & 0xfe;
            uVar15 = uVar15 + 1;
          } while (uVar15 < uVar10);
        }
        if ((uint)uVar15 < maxslot) {
          uVar15 = uVar15 & 0xffffffff;
          do {
            udf[uVar15] = udf[uVar15] * '\x03';
            uVar15 = uVar15 + 1;
          } while (__n != uVar15);
        }
        if ((0xfffffffd < uVar7) && (puVar5 = (undefined8 *)0x0, bVar3 != 0)) {
          uVar10 = 0;
          do {
            udf[uVar10] = udf[uVar10] * '\x03';
            uVar10 = uVar10 + 1;
          } while (bVar3 != uVar10);
        }
        if (uVar7 < 0xfffffffe) goto LAB_0012ef25;
LAB_0012ef01:
        bVar2 = false;
      }
      else {
        if ((byte)uVar14 != 0x47) {
          if ((uVar14 & 0xff) == 0x3f) {
            if (bVar3 - 1 < maxslot) {
              lVar11 = 0;
              do {
                udf[lVar11 + (ulong)(bVar3 - 1)] = udf[lVar11 + (ulong)(bVar3 - 1)] & 0xfe;
                lVar11 = lVar11 + 1;
              } while ((maxslot + 1) - (uint)bVar3 != (int)lVar11);
            }
          }
          else if ((uVar14 & 0xff) == 0x2c) {
            if ((uVar14 >> 8 & 0xff) <= uVar14 >> 0x10) {
              uVar10 = (ulong)(uVar14 >> 8 & 0xff);
              do {
                udf[uVar10] = udf[uVar10] * '\x03';
                uVar10 = uVar10 + 1;
              } while ((ulong)(uVar14 >> 0x10) + 1 != uVar10);
            }
          }
          goto LAB_0012ef25;
        }
switchD_0012ed07_caseD_c:
        bVar2 = false;
        puVar5 = (undefined8 *)(ulong)maxslot;
      }
    }
LAB_0012ef77:
    pc = puVar6;
    if (!bVar2) {
      return (BCReg)puVar5;
    }
  } while( true );
}

Assistant:

static BCReg snap_usedef(jit_State *J, uint8_t *udf,
			 const BCIns *pc, BCReg maxslot)
{
  BCReg s;
  GCobj *o;

  if (maxslot == 0) return 0;
#ifdef LUAJIT_USE_VALGRIND
  /* Avoid errors for harmless reads beyond maxslot. */
  memset(udf, 1, SNAP_USEDEF_SLOTS);
#else
  memset(udf, 1, maxslot);
#endif

  /* Treat open upvalues as used. */
  o = gcref(J->L->openupval);
  while (o) {
    if (uvval(gco2uv(o)) < J->L->base) break;
    udf[uvval(gco2uv(o)) - J->L->base] = 0;
    o = gcref(o->gch.nextgc);
  }

#define USE_SLOT(s)		udf[(s)] &= ~1
#define DEF_SLOT(s)		udf[(s)] *= 3

  /* Scan through following bytecode and check for uses/defs. */
  lj_assertJ(pc >= proto_bc(J->pt) && pc < proto_bc(J->pt) + J->pt->sizebc,
	     "snapshot PC out of range");
  for (;;) {
    BCIns ins = *pc++;
    BCOp op = bc_op(ins);
    switch (bcmode_b(op)) {
    case BCMvar: USE_SLOT(bc_b(ins)); break;
    default: break;
    }
    switch (bcmode_c(op)) {
    case BCMvar: USE_SLOT(bc_c(ins)); break;
    case BCMrbase:
      lj_assertJ(op == BC_CAT, "unhandled op %d with RC rbase", op);
      for (s = bc_b(ins); s <= bc_c(ins); s++) USE_SLOT(s);
      for (; s < maxslot; s++) DEF_SLOT(s);
      break;
    case BCMjump:
    handle_jump: {
      BCReg minslot = bc_a(ins);
      if (op >= BC_FORI && op <= BC_JFORL) minslot += FORL_EXT;
      else if (op >= BC_ITERL && op <= BC_JITERL) minslot += bc_b(pc[-2])-1;
      else if (op == BC_UCLO) {
	ptrdiff_t delta = bc_j(ins);
	if (delta < 0) return maxslot;  /* Prevent loop. */
	pc += delta;
	break;
      }
      for (s = minslot; s < maxslot; s++) DEF_SLOT(s);
      return minslot < maxslot ? minslot : maxslot;
      }
    case BCMlit:
      if (op == BC_JFORL || op == BC_JITERL || op == BC_JLOOP) {
	goto handle_jump;
      } else if (bc_isret(op)) {
	BCReg top = op == BC_RETM ? maxslot : (bc_a(ins) + bc_d(ins)-1);
	for (s = 0; s < bc_a(ins); s++) DEF_SLOT(s);
	for (; s < top; s++) USE_SLOT(s);
	for (; s < maxslot; s++) DEF_SLOT(s);
	return 0;
      }
      break;
    case BCMfunc: return maxslot;  /* NYI: will abort, anyway. */
    default: break;
    }
    switch (bcmode_a(op)) {
    case BCMvar: USE_SLOT(bc_a(ins)); break;
    case BCMdst:
       if (!(op == BC_ISTC || op == BC_ISFC)) DEF_SLOT(bc_a(ins));
       break;
    case BCMbase:
      if (op >= BC_CALLM && op <= BC_ITERN) {
	BCReg top = (op == BC_CALLM || op == BC_CALLMT || bc_c(ins) == 0) ?
		    maxslot : (bc_a(ins) + bc_c(ins)+LJ_FR2);
	if (LJ_FR2) DEF_SLOT(bc_a(ins)+1);
	s = bc_a(ins) - ((op == BC_ITERC || op == BC_ITERN) ? 3 : 0);
	for (; s < top; s++) USE_SLOT(s);
	for (; s < maxslot; s++) DEF_SLOT(s);
	if (op == BC_CALLT || op == BC_CALLMT) {
	  for (s = 0; s < bc_a(ins); s++) DEF_SLOT(s);
	  return 0;
	}
      } else if (op == BC_VARG) {
	return maxslot;  /* NYI: punt. */
      } else if (op == BC_KNIL) {
	for (s = bc_a(ins); s <= bc_d(ins); s++) DEF_SLOT(s);
      } else if (op == BC_TSETM) {
	for (s = bc_a(ins)-1; s < maxslot; s++) USE_SLOT(s);
      }
      break;
    default: break;
    }
    lj_assertJ(pc >= proto_bc(J->pt) && pc < proto_bc(J->pt) + J->pt->sizebc,
	       "use/def analysis PC out of range");
  }

#undef USE_SLOT
#undef DEF_SLOT

  return 0;  /* unreachable */
}